

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

void __thiscall
WavingSketch<8U,_16U,_4U>::WavingSketch
          (WavingSketch<8U,_16U,_4U> *this,int mem,int _HIT,uint32_t _HASH_NUM)

{
  uchar *puVar1;
  uint uVar2;
  BitSet *this_00;
  Bucket *__s;
  clock_t cVar3;
  long lVar4;
  ulong __n;
  
  Abstract<4U>::Abstract(&this->super_Abstract<4U>);
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00111ae0;
  this->BUCKET_NUM = (uint32_t)((ulong)(long)mem / 0x60);
  this->HASH_NUM = _HASH_NUM;
  this->LENGTH = mem << 2;
  this->cnt = 0;
  (this->super_Abstract<4U>).HIT = _HIT;
  std::__cxx11::string::assign((char *)&(this->super_Abstract<4U>).name);
  this->record = 0;
  this_00 = (BitSet *)operator_new(0x10);
  BitSet::BitSet(this_00,this->LENGTH);
  this->bitset = this_00;
  uVar2 = this->BUCKET_NUM;
  __n = (ulong)uVar2 * 0x60;
  __s = (Bucket *)operator_new__(__n);
  if ((ulong)uVar2 != 0) {
    lVar4 = 0;
    do {
      puVar1 = __s->items[0].str + lVar4;
      *(undefined8 *)puVar1 = 0;
      *(undefined8 *)(puVar1 + 8) = 0;
      *(undefined8 *)(puVar1 + 0x10) = 0;
      *(undefined8 *)(puVar1 + 0x18) = 0;
      lVar4 = lVar4 + 0x60;
    } while (__n - lVar4 != 0);
  }
  this->buckets = __s;
  memset(__s,0,__n);
  Abstract<4U>::rename(&this->super_Abstract<4U>,(char *)0x8,(char *)0x10);
  std::__cxx11::string::assign((char *)&(this->super_Abstract<4U>).sep);
  cVar3 = clock();
  this->seed_choice = (uint32_t)cVar3;
  sleep(1);
  cVar3 = clock();
  this->seed_incast = (uint32_t)cVar3;
  sleep(1);
  cVar3 = clock();
  this->seed_s = (uint32_t)cVar3;
  return;
}

Assistant:

WavingSketch(int mem, int _HIT, uint32_t _HASH_NUM = 3)
		: BUCKET_NUM(mem / sizeof(Bucket)),
		HASH_NUM(_HASH_NUM),
		LENGTH(mem * 8 * 1 / 2),
		cnt(0)
	{
		this->HIT = _HIT;
		this->name = (char*)"WavingSketch";
		record = 0;
		bitset = new BitSet(LENGTH);
		buckets = new Bucket[BUCKET_NUM];
		memset(buckets, 0, BUCKET_NUM * sizeof(Bucket));
		this->rename(int(slot_num), int(counter_num));
		this->sep = "\t";
		seed_choice = std::clock();
		sleep(1);
		seed_incast = std::clock();
		sleep(1);
		seed_s = std::clock();
		// std::printf("seed_choice: %d, seed_incast: %d, seed_s: %d\n",
		// seed_choice, seed_incast, seed_s);
	}